

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

char * __thiscall leveldb::Arena::AllocateFallback(Arena *this,size_t bytes)

{
  char *pcVar1;
  
  if (0x400 < bytes) {
    pcVar1 = AllocateNewBlock(this,bytes);
    return pcVar1;
  }
  pcVar1 = AllocateNewBlock(this,0x1000);
  this->alloc_ptr_ = pcVar1 + bytes;
  this->alloc_bytes_remaining_ = 0x1000 - bytes;
  return pcVar1;
}

Assistant:

char* Arena::AllocateFallback(size_t bytes) {
  if (bytes > kBlockSize / 4) {
    // Object is more than a quarter of our block size.  Allocate it separately
    // to avoid wasting too much space in leftover bytes.
    char* result = AllocateNewBlock(bytes);
    return result;
  }

  // We waste the remaining space in the current block.
  alloc_ptr_ = AllocateNewBlock(kBlockSize);
  alloc_bytes_remaining_ = kBlockSize;

  char* result = alloc_ptr_;
  alloc_ptr_ += bytes;
  alloc_bytes_remaining_ -= bytes;
  return result;
}